

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

ELEMENT_TYPE * getElementType(XML_Parser parser,ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  XML_Char *name_00;
  ELEMENT_TYPE *ret;
  XML_Char *name;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  name_00 = poolStoreString((STRING_POOL *)((long)parser + 0x330),enc,ptr,end);
  if (name_00 == (XML_Char *)0x0) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    parser_local = lookup((HASH_TABLE *)((long)parser + 0x2b8),name_00,0x28);
    if ((ELEMENT_TYPE *)parser_local == (ELEMENT_TYPE *)0x0) {
      parser_local = (XML_Parser)0x0;
    }
    else if (((ELEMENT_TYPE *)parser_local)->name == name_00) {
      *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
      iVar1 = setElementTypePrefix(parser,(ELEMENT_TYPE *)parser_local);
      if (iVar1 == 0) {
        parser_local = (XML_Parser)0x0;
      }
    }
    else {
      *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
    }
  }
  return (ELEMENT_TYPE *)parser_local;
}

Assistant:

static ELEMENT_TYPE *
getElementType(XML_Parser parser,
               const ENCODING *enc,
               const char *ptr,
               const char *end)
{
  const XML_Char *name = poolStoreString(&dtd.pool, enc, ptr, end);
  ELEMENT_TYPE *ret;

  if (! name)
    return 0;
  ret = (ELEMENT_TYPE *) lookup(&dtd.elementTypes, name, sizeof(ELEMENT_TYPE));
  if (! ret)
    return 0;
  if (ret->name != name)
    poolDiscard(&dtd.pool);
  else {
    poolFinish(&dtd.pool);
    if (!setElementTypePrefix(parser, ret))
      return 0;
  }
  return ret;
}